

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O1

exr_result_t exr_get_chunk_unpacked_size(exr_const_context_t ctxt,int part_index,uint64_t *out)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (out != (uint64_t *)0x0) {
      *out = *(uint64_t *)(*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 0xe8);
      return 0;
    }
    eVar1 = (**(code **)(ctxt + 0x38))(ctxt,3);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return eVar1;
}

Assistant:

exr_result_t
exr_get_chunk_unpacked_size (
    exr_const_context_t ctxt, int part_index, uint64_t* out)
{
    uint64_t sz;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    sz = part->unpacked_size_per_chunk;
    EXR_UNLOCK_WRITE (pctxt);

    if (!out) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    *out = sz;
    return EXR_ERR_SUCCESS;
}